

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O2

void __thiscall TileSwitch::setCharID(TileSwitch *this,char charID)

{
  Board *pBVar1;
  iterator iVar2;
  vector<TileSwitch*,std::allocator<TileSwitch*>> *this_00;
  mapped_type *this_01;
  const_iterator __position;
  char charID_local;
  locale local_78 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  string local_50;
  key_type local_30;
  
  charID_local = charID;
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  iVar2 = std::
          _Hashtable<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(pBVar1->switchKeybinds)._M_h,&(this->super_Tile).field_0x21);
  __position._M_current =
       *(TileSwitch ***)
        ((long)iVar2.
               super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
               ._M_cur + 0x10);
  do {
    if (__position._M_current ==
        *(TileSwitch ***)
         ((long)iVar2.
                super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                ._M_cur + 0x18)) {
LAB_00136b9e:
      (this->super_Tile).field_0x21 = charID;
      pBVar1 = Tile::getBoardPtr(&this->super_Tile);
      this_00 = (vector<TileSwitch*,std::allocator<TileSwitch*>> *)
                std::__detail::
                _Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pBVar1->switchKeybinds,&charID_local);
      local_70._M_dataplus._M_p = (pointer)this;
      std::vector<TileSwitch*,std::allocator<TileSwitch*>>::emplace_back<TileSwitch*>
                (this_00,(TileSwitch **)&local_70);
      pBVar1 = Tile::getBoardPtr(&this->super_Tile);
      local_30 = &this->super_Tile;
      this_01 = std::__detail::
                _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&pBVar1->tileLabels,&local_30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
      std::locale::locale(local_78);
      sf::String::String((String *)&local_70,&local_50,local_78);
      sf::Text::setString(this_01,(String *)&local_70);
      std::__cxx11::
      basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
      ~basic_string(&local_70);
      std::locale::~locale(local_78);
      std::__cxx11::string::~string((string *)&local_50);
      (*(this->super_Tile)._vptr_Tile[8])(this,1,0);
      pBVar1 = Tile::getBoardPtr(&this->super_Tile);
      pBVar1->changesMade = true;
      return;
    }
    if (*__position._M_current == this) {
      std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>::erase
                ((vector<TileSwitch_*,_std::allocator<TileSwitch_*>_> *)
                 ((long)iVar2.
                        super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                        ._M_cur + 0x10),__position);
      goto LAB_00136b9e;
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void TileSwitch::setCharID(char charID) {
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    _charID = charID;
    getBoardPtr()->switchKeybinds[charID].push_back(this);
    getBoardPtr()->tileLabels[this].setString(string(1, charID));
    addUpdate(true);
    getBoardPtr()->changesMade = true;
}